

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Encoding,_char> *b)

{
  Encoding EVar1;
  JSON<char[23],_char> local_28;
  char local_11;
  
  EVar1 = *b->object;
  switch(EVar1) {
  case DW_ATE_address:
    local_28.object = (char (*) [23])0x1816aa;
    goto LAB_0016311e;
  case DW_ATE_boolean:
    local_28.object = (char (*) [23])0x1816b9;
    goto LAB_0016311e;
  case DW_ATE_complex_float:
    local_28.object = (char (*) [23])0x1816c8;
    goto LAB_001630e8;
  case DW_ATE_float:
    local_28.object = (char (*) [23])0x1816dd;
    goto LAB_00163144;
  case DW_ATE_signed:
    local_28.object = (char (*) [23])0x1816ea;
    goto LAB_00163043;
  case DW_ATE_signed_char:
    local_28.context = &local_11;
    local_11 = '\0';
    local_28.object = (char (*) [23])0x1816f8;
    operator<<(os,(JSON<char[19],_char> *)&local_28);
    break;
  case DW_ATE_unsigned:
    local_28.context = &local_11;
    local_11 = '\0';
    local_28.object = (char (*) [23])0x18170b;
    operator<<(os,(JSON<char[16],_char> *)&local_28);
    break;
  case DW_ATE_unsigned_char:
    local_28.object = (char (*) [23])0x18171b;
    goto LAB_001630e8;
  case DW_ATE_imaginary_float:
    local_28.context = &local_11;
    local_11 = '\0';
    local_28.object = (char (*) [23])0x181730;
    operator<<(os,&local_28);
    break;
  case DW_ATE_packed_decimal:
    local_28.object = (char (*) [23])0x181747;
    goto LAB_001631cd;
  case DW_ATE_numeric_string:
    local_28.object = (char (*) [23])0x18175d;
    goto LAB_001631cd;
  case DW_ATE_edited:
    local_28.object = (char (*) [23])0x181773;
LAB_00163043:
    local_11 = '\0';
    local_28.context = &local_11;
    operator<<(os,(JSON<char[14],_char> *)&local_28);
    break;
  case DW_ATE_signed_fixed:
    local_28.context = &local_11;
    local_11 = '\0';
    local_28.object = (char (*) [23])0x181781;
    operator<<(os,(JSON<char[20],_char> *)&local_28);
    break;
  case DW_ATE_unsigned_fixed:
    local_28.object = (char (*) [23])0x181795;
LAB_001631cd:
    local_11 = '\0';
    local_28.context = &local_11;
    operator<<(os,(JSON<char[22],_char> *)&local_28);
    break;
  case DW_ATE_decimal_float:
    local_28.object = (char (*) [23])0x1817ab;
LAB_001630e8:
    local_11 = '\0';
    local_28.context = &local_11;
    operator<<(os,(JSON<char[21],_char> *)&local_28);
    break;
  case DW_ATE_UTF:
    local_28.object = (char (*) [23])0x1817c0;
    goto LAB_001630b2;
  case DW_ATE_UCS:
    local_28.object = (char (*) [23])0x1817cb;
LAB_001630b2:
    local_11 = '\0';
    local_28.context = &local_11;
    operator<<(os,(JSON<char[11],_char> *)&local_28);
    break;
  case DW_ATE_ASCII:
    local_28.object = (char (*) [23])0x1817d6;
LAB_00163144:
    local_11 = '\0';
    local_28.context = &local_11;
    operator<<(os,(JSON<char[13],_char> *)&local_28);
    break;
  default:
    if (EVar1 == DW_ATE_lo_user) {
      local_28.object = (char (*) [23])0x1817e3;
    }
    else {
      if (EVar1 != DW_ATE_hi_user) {
        std::ostream::operator<<(os,EVar1);
        return os;
      }
      local_28.object = (char (*) [23])0x1817f2;
    }
LAB_0016311e:
    local_11 = '\0';
    local_28.context = &local_11;
    operator<<(os,(JSON<char[15],_char> *)&local_28);
  }
  return os;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Encoding> &b)
{
#define DWARF_ATE(enc, val) case Dwarf::enc: os << json(#enc) ; break;

    switch (b.object) {
#include "libpstack/dwarf/encodings.h"
        default: os << int(b.object); break;
    }
    return os;
}